

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_vec2 nk_widget_size(nk_context *ctx)

{
  nk_vec2 nVar1;
  nk_rect bounds;
  undefined1 local_18 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4a5e,"struct nk_vec2 nk_widget_size(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    nk_layout_peek((nk_rect *)local_18,ctx);
    nVar1.x = (float)local_18._8_4_;
    nVar1.y = (float)local_18._12_4_;
    return nVar1;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4a5f,"struct nk_vec2 nk_widget_size(struct nk_context *)");
}

Assistant:

NK_API struct nk_vec2
nk_widget_size(struct nk_context *ctx)
{
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return nk_vec2(0,0);

    nk_layout_peek(&bounds, ctx);
    return nk_vec2(bounds.w, bounds.h);
}